

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.cc
# Opt level: O3

void __thiscall kratos::GeneratorDebugVisitor::~GeneratorDebugVisitor(GeneratorDebugVisitor *this)

{
  (this->super_IRVisitor)._vptr_IRVisitor = (_func_int **)&PTR_visit_root_002b8d78;
  std::_Rb_tree<$6f46ab9c$>::~_Rb_tree(&(this->result_)._M_t);
  (this->super_IRVisitor)._vptr_IRVisitor = (_func_int **)&PTR_visit_root_002b6338;
  std::
  _Hashtable<kratos::IRNode_*,_kratos::IRNode_*,_std::allocator<kratos::IRNode_*>,_std::__detail::_Identity,_std::equal_to<kratos::IRNode_*>,_std::hash<kratos::IRNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&(this->super_IRVisitor).visited_._M_h);
  operator_delete(this,0x78);
  return;
}

Assistant:

void visit(Generator *generator) override {
        if (result_.find(generator->name) != result_.end()) return;
        if (!generator->fn_name_ln.empty()) {
            DebugInfoVisitor visitor;
            visitor.result().emplace(1, generator->fn_name_ln);
            visitor.visit_content(generator);
            result_.emplace(generator->name, visitor.result());
        }
    }